

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::_do_reorder(Tree *this,size_t *node,size_t count)

{
  size_t count_00;
  size_t local_20;
  
  if (*node != count) {
    _swap(this,*node,count);
    *node = count;
  }
  count_00 = count + 1;
  local_20 = first_child(this,count);
  for (; local_20 != 0xffffffffffffffff; local_20 = next_sibling(this,local_20)) {
    count_00 = _do_reorder(this,&local_20,count_00);
  }
  return count_00;
}

Assistant:

size_t Tree::_do_reorder(size_t *node, size_t count)
{
    // swap this node if it's not in place
    if(*node != count)
    {
        _swap(*node, count);
        *node = count;
    }
    ++count; // bump the count from this node

    // now descend in the hierarchy
    for(size_t i = first_child(*node); i != NONE; i = next_sibling(i))
    {
        // this child may have been relocated to a different index,
        // so get an updated version
        count = _do_reorder(&i, count);
    }
    return count;
}